

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler
          (CombinedImageSamplerHandler *this,SPIRFunction *caller,VariableID combined_module_id,
          VariableID image_id,VariableID sampler_id,bool depth)

{
  Compiler *pCVar1;
  Compiler *pCVar2;
  bool bVar3;
  uint32_t uVar4;
  Parameter *pPVar5;
  Parameter *pPVar6;
  Parameter *pPVar7;
  CombinedImageSamplerParameter *pCVar8;
  CombinedImageSamplerParameter *pCVar9;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *this_00;
  bool local_1b9;
  bool local_199;
  Parameter local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  spirv_cross local_f0 [36];
  ID local_cc;
  TypedID<(spirv_cross::Types)2> local_c8;
  ID local_c4;
  ID local_c0;
  ID local_bc;
  ID local_b8;
  bool local_b1;
  int local_b0;
  StorageClass SStack_ac;
  bool relaxed_precision;
  TypedID<(spirv_cross::Types)1> local_a8;
  TypedID<(spirv_cross::Types)0> local_a4;
  SPIRType *local_a0;
  SPIRType *ptr_type;
  SPIRType *type;
  SPIRType *base;
  uint32_t combined_id;
  uint32_t ptr_type_id;
  uint32_t type_id;
  uint32_t id;
  CombinedImageSamplerParameter *local_70;
  CombinedImageSamplerParameter *itr;
  TypedID<(spirv_cross::Types)2> local_60;
  VariableID local_5c;
  Parameter *local_58;
  Parameter *sampler_itr;
  Parameter *local_48;
  Parameter *texture_itr;
  uint32_t local_38;
  CombinedImageSamplerParameter param;
  bool depth_local;
  SPIRFunction *caller_local;
  CombinedImageSamplerHandler *this_local;
  TypedID<(spirv_cross::Types)2> local_10;
  VariableID sampler_id_local;
  VariableID image_id_local;
  VariableID combined_module_id_local;
  
  param.sampler_id.id._3_1_ = depth;
  unique0x100006fd = caller;
  this_local._4_4_ = sampler_id.id;
  local_10.id = image_id.id;
  sampler_id_local = combined_module_id;
  TypedID<(spirv_cross::Types)2>::TypedID
            ((TypedID<(spirv_cross::Types)2> *)((long)&texture_itr + 4),0);
  local_38 = local_10.id;
  param.id.id = this_local._4_4_;
  param.image_id.id._0_1_ = 1;
  param.image_id.id._1_1_ = 1;
  param.image_id.id._2_1_ = param.sampler_id.id._3_1_ & 1;
  pPVar5 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  sampler_itr._4_4_ = local_10.id;
  local_48 = ::std::
             find_if<spirv_cross::SPIRFunction::Parameter*,spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::__0>
                       (pPVar5,pPVar6,(anon_class_4_1_b4afabfd_for__M_pred)local_10.id);
  pPVar5 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  pPVar6 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  local_5c.id = this_local._4_4_;
  local_58 = ::std::
             find_if<spirv_cross::SPIRFunction::Parameter*,spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::__1>
                       (pPVar5,pPVar6,(anon_class_4_1_a60e1e70_for__M_pred)this_local._4_4_);
  pPVar5 = local_48;
  pPVar7 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  pPVar6 = local_48;
  if (pPVar5 != pPVar7) {
    param.image_id.id._0_1_ = 0;
    pPVar5 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                       (&stack0xffffffffffffffd8->arguments);
    TypedID<(spirv_cross::Types)2>::TypedID
              (&local_60,(uint32_t)(((long)pPVar6 - (long)pPVar5) / 0x14));
    local_38 = local_60.id;
  }
  pPVar5 = local_58;
  pPVar7 = ::std::end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                     (&stack0xffffffffffffffd8->arguments);
  pPVar6 = local_58;
  if (pPVar5 != pPVar7) {
    param.image_id.id._1_1_ = 0;
    pPVar5 = ::std::begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,8ul>>
                       (&stack0xffffffffffffffd8->arguments);
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&itr + 4),
               (uint32_t)(((long)pPVar6 - (long)pPVar5) / 0x14));
    param.id.id = itr._4_4_;
  }
  if ((((byte)param.image_id.id & 1) == 0) || ((param.image_id.id._1_1_ & 1) == 0)) {
    pCVar8 = ::std::
             begin<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                       (&stack0xffffffffffffffd8->combined_parameters);
    pCVar9 = ::std::
             end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                       (&stack0xffffffffffffffd8->combined_parameters);
    _type_id = (CombinedImageSamplerParameter *)((long)&texture_itr + 4);
    pCVar8 = ::std::
             find_if<spirv_cross::SPIRFunction::CombinedImageSamplerParameter*,spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::__2>
                       (pCVar8,pCVar9,_type_id);
    local_70 = pCVar8;
    pCVar9 = ::std::
             end<spirv_cross::SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,8ul>>
                       (&stack0xffffffffffffffd8->combined_parameters);
    if (pCVar8 == pCVar9) {
      combined_id = ParsedIR::increase_bound_by(&this->compiler->ir,3);
      base._4_4_ = combined_id + 1;
      base._0_4_ = combined_id + 2;
      pCVar1 = this->compiler;
      ptr_type_id = combined_id;
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_10);
      type = expression_type(pCVar1,uVar4);
      ptr_type = set<spirv_cross::SPIRType>(this->compiler,combined_id);
      local_a0 = set<spirv_cross::SPIRType>(this->compiler,base._4_4_);
      SPIRType::operator=(ptr_type,type);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_a4,combined_id);
      (ptr_type->super_IVariant).self.id = local_a4.id;
      *(undefined4 *)&(ptr_type->super_IVariant).field_0xc = 0x11;
      ptr_type->pointer = false;
      ptr_type->storage = StorageClassGeneric;
      (ptr_type->image).depth = (bool)(param.sampler_id.id._3_1_ & 1);
      SPIRType::operator=(local_a0,ptr_type);
      local_a0->pointer = true;
      local_a0->storage = StorageClassUniformConstant;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_a8,combined_id);
      (local_a0->parent_type).id = local_a8.id;
      SStack_ac = StorageClassFunction;
      local_b0 = 0;
      set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
                (this->compiler,(uint32_t)base,(uint *)((long)&base + 4),&stack0xffffffffffffff54,
                 &local_b0);
      pCVar1 = this->compiler;
      TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                (&local_b8,(TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4));
      bVar3 = has_decoration(pCVar1,local_b8,DecorationRelaxedPrecision);
      local_199 = true;
      if (!bVar3) {
        pCVar1 = this->compiler;
        TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>(&local_bc,&local_10);
        bVar3 = has_decoration(pCVar1,local_bc,DecorationRelaxedPrecision);
        local_199 = true;
        if (!bVar3) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&sampler_id_local);
          local_1b9 = false;
          if (uVar4 != 0) {
            pCVar1 = this->compiler;
            TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                      (&local_c0,&sampler_id_local);
            local_1b9 = has_decoration(pCVar1,local_c0,DecorationRelaxedPrecision);
          }
          local_199 = local_1b9;
        }
      }
      local_b1 = local_199;
      if (local_199 != false) {
        pCVar1 = this->compiler;
        TypedID<(spirv_cross::Types)0>::TypedID(&local_c4,(uint32_t)base);
        set_decoration(pCVar1,local_c4,DecorationRelaxedPrecision,0);
      }
      TypedID<(spirv_cross::Types)2>::TypedID(&local_c8,(uint32_t)base);
      texture_itr._4_4_ = local_c8.id;
      pCVar1 = this->compiler;
      TypedID<(spirv_cross::Types)0>::TypedID(&local_cc,(uint32_t)base);
      pCVar2 = this->compiler;
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_10);
      (*pCVar2->_vptr_Compiler[6])(local_110,pCVar2,(ulong)uVar4,1);
      pCVar2 = this->compiler;
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
      (*pCVar2->_vptr_Compiler[6])(local_130,pCVar2,(ulong)uVar4,1);
      join<char_const(&)[21],std::__cxx11::string,std::__cxx11::string>
                (local_f0,(char (*) [21])"SPIRV_Cross_Combined",local_110,local_130);
      set_name(pCVar1,local_cc,(string *)local_f0);
      ::std::__cxx11::string::~string((string *)local_f0);
      ::std::__cxx11::string::~string((string *)local_130);
      ::std::__cxx11::string::~string((string *)local_110);
      SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::push_back
                (&stack0xffffffffffffffd8->combined_parameters,
                 (CombinedImageSamplerParameter *)((long)&texture_itr + 4));
      this_00 = &stack0xffffffffffffffd8->shadow_arguments;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_150.type,base._4_4_);
      TypedID<(spirv_cross::Types)0>::TypedID(&local_150.id,(uint32_t)base);
      local_150.read_count = 0;
      local_150.write_count = 0;
      local_150.alias_global_variable = true;
      SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::push_back(this_00,&local_150);
    }
  }
  return;
}

Assistant:

void Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(SPIRFunction &caller,
                                                                            VariableID combined_module_id,
                                                                            VariableID image_id, VariableID sampler_id,
                                                                            bool depth)
{
	// We now have a texture ID and a sampler ID which will either be found as a global
	// or a parameter in our own function. If both are global, they will not need a parameter,
	// otherwise, add it to our list.
	SPIRFunction::CombinedImageSamplerParameter param = {
		0u, image_id, sampler_id, true, true, depth,
	};

	auto texture_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [image_id](const SPIRFunction::Parameter &p) { return p.id == image_id; });
	auto sampler_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [sampler_id](const SPIRFunction::Parameter &p) { return p.id == sampler_id; });

	if (texture_itr != end(caller.arguments))
	{
		param.global_image = false;
		param.image_id = uint32_t(texture_itr - begin(caller.arguments));
	}

	if (sampler_itr != end(caller.arguments))
	{
		param.global_sampler = false;
		param.sampler_id = uint32_t(sampler_itr - begin(caller.arguments));
	}

	if (param.global_image && param.global_sampler)
		return;

	auto itr = find_if(begin(caller.combined_parameters), end(caller.combined_parameters),
	                   [&param](const SPIRFunction::CombinedImageSamplerParameter &p) {
		                   return param.image_id == p.image_id && param.sampler_id == p.sampler_id &&
		                          param.global_image == p.global_image && param.global_sampler == p.global_sampler;
	                   });

	if (itr == end(caller.combined_parameters))
	{
		uint32_t id = compiler.ir.increase_bound_by(3);
		auto type_id = id + 0;
		auto ptr_type_id = id + 1;
		auto combined_id = id + 2;
		auto &base = compiler.expression_type(image_id);
		auto &type = compiler.set<SPIRType>(type_id);
		auto &ptr_type = compiler.set<SPIRType>(ptr_type_id);

		type = base;
		type.self = type_id;
		type.basetype = SPIRType::SampledImage;
		type.pointer = false;
		type.storage = StorageClassGeneric;
		type.image.depth = depth;

		ptr_type = type;
		ptr_type.pointer = true;
		ptr_type.storage = StorageClassUniformConstant;
		ptr_type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, ptr_type_id, StorageClassFunction, 0);

		// Inherit RelaxedPrecision.
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    compiler.has_decoration(sampler_id, DecorationRelaxedPrecision) ||
		    compiler.has_decoration(image_id, DecorationRelaxedPrecision) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		param.id = combined_id;

		compiler.set_name(combined_id,
		                  join("SPIRV_Cross_Combined", compiler.to_name(image_id), compiler.to_name(sampler_id)));

		caller.combined_parameters.push_back(param);
		caller.shadow_arguments.push_back({ ptr_type_id, combined_id, 0u, 0u, true });
	}
}